

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharTrie.cpp
# Opt level: O0

CharTrie * __thiscall UnifiedRegex::CharTrie::Add(CharTrie *this,ArenaAllocator *allocator,Char c)

{
  CharTrieEntry *pCVar1;
  CharTrieEntry *pCVar2;
  CharTrieEntry *pCVar3;
  undefined3 uVar4;
  int iVar5;
  bool bVar6;
  int *piVar7;
  CharTrieEntry *pCVar8;
  int iVar9;
  int local_2c;
  int local_28;
  int j;
  int local_20;
  int newCapacity;
  int i;
  Char c_local;
  ArenaAllocator *allocator_local;
  CharTrie *this_local;
  
  newCapacity._2_2_ = c;
  _i = &allocator->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  allocator_local = (ArenaAllocator *)this;
  bVar6 = Find(this,c,&local_20);
  if (!bVar6) {
    if (this->capacity <= this->count) {
      local_28 = this->capacity << 1;
      piVar7 = max<int>(&local_28,&initCapacity);
      j = *piVar7;
      pCVar8 = (CharTrieEntry *)
               Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Realloc
                         (_i,this->children,(long)this->capacity << 5,(long)j << 5);
      this->children = pCVar8;
      this->capacity = j;
    }
    for (local_2c = this->count; local_20 < local_2c; local_2c = local_2c + -1) {
      this->children[local_2c].c = this->children[local_2c + -1].c;
      pCVar8 = this->children;
      iVar9 = local_2c + -1;
      pCVar1 = this->children;
      pCVar1[local_2c].node.children = pCVar8[iVar9].node.children;
      pCVar2 = pCVar8 + iVar9;
      uVar4 = *(undefined3 *)&(pCVar2->node).field_0x9;
      iVar5 = (pCVar2->node).capacity;
      pCVar3 = pCVar1 + local_2c;
      (pCVar3->node).isAccepting = (pCVar2->node).isAccepting;
      *(undefined3 *)&(pCVar3->node).field_0x9 = uVar4;
      (pCVar3->node).capacity = iVar5;
      pCVar1[local_2c].node.count = pCVar8[iVar9].node.count;
    }
    this->children[local_20].c = newCapacity._2_2_;
    Reset(&this->children[local_20].node);
    this->count = this->count + 1;
  }
  return &this->children[local_20].node;
}

Assistant:

CharTrie* CharTrie::Add(ArenaAllocator* allocator, Char c)
    {
        int i;
        if (!Find(c, i))
        {
            if (capacity <= count)
            {
                int newCapacity = max(capacity * 2, initCapacity);
                children = (CharTrieEntry*)allocator->Realloc(children, capacity * sizeof(CharTrieEntry), newCapacity * sizeof(CharTrieEntry));
                capacity = newCapacity;
            }

            for (int j = count; j > i; j--)
            {
                children[j].c = children[j - 1].c;
                children[j].node = children[j - 1].node;
            }
            children[i].c = c;
            children[i].node.Reset();
            count++;
        }
        return &children[i].node;
    }